

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

char * rtosc::Ports::collapsePath(char *p)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  char *p_end;
  
  pcVar2 = p + -2;
  do {
    pcVar4 = pcVar2 + 2;
    pcVar2 = pcVar2 + 1;
  } while (*pcVar4 != '\0');
  if (p <= pcVar2) {
    iVar5 = 0;
    pcVar4 = pcVar2;
    do {
      if (((((long)pcVar4 - (long)p < 2) || (*pcVar4 != '.')) || (pcVar4[-1] != '.')) ||
         (pcVar3 = pcVar4, pcVar4[-2] != '/')) {
        pcVar3 = pcVar4;
        pcVar6 = pcVar2;
        if (iVar5 == 0) {
          do {
            pcVar2 = pcVar6;
            iVar5 = 0;
            if (pcVar4 < p) break;
            cVar1 = *pcVar4;
            pcVar4 = pcVar4 + -1;
            pcVar2 = pcVar6 + -1;
            *pcVar6 = cVar1;
            pcVar6 = pcVar2;
            iVar5 = 0;
          } while (cVar1 != '/');
        }
        else {
          do {
            pcVar4 = pcVar3;
            if (pcVar3 < p) break;
            pcVar4 = pcVar3 + -1;
            cVar1 = *pcVar3;
            pcVar3 = pcVar4;
          } while (cVar1 != '/');
          iVar5 = iVar5 + -1;
        }
      }
      else {
        do {
          pcVar4 = pcVar3;
          if (pcVar3 < p) break;
          pcVar4 = pcVar3 + -1;
          cVar1 = *pcVar3;
          pcVar3 = pcVar4;
        } while (cVar1 != '/');
        iVar5 = iVar5 + 1;
      }
    } while (p <= pcVar4);
  }
  return pcVar2 + 1;
}

Assistant:

char *Ports::collapsePath(char *p)
{
    //obtain the pointer to the last non-null char
    char *p_end = p;
    while(*p_end) p_end++;
    p_end--;

    //number of subpaths to consume
    int consuming = 0;

    char *write_pos = p_end;
    char *read_pos = p_end;
    while(read_pos >= p) {
        //per path chunk either
        //(1) find a parent ref and inc consuming
        //(2) find a normal ref and consume
        //(3) find a normal ref and write through
        bool ppath = parent_path_p(read_pos, p);
        if(ppath) {
            read_path(read_pos, p);
            consuming++;
        } else if(consuming) {
            read_path(read_pos, p);
            consuming--;
        } else
            move_path(read_pos, write_pos, p);
    }
    //return last written location, not next to write
    return write_pos+1;
}